

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

exr_result_t
exr_encoding_update(exr_const_context_t ctxt,int part_index,exr_chunk_info_t *cinfo,
                   exr_encode_pipeline_t *encode)

{
  _internal_exr_part *part;
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int32_t iVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  int32_t iVar10;
  int32_t iVar11;
  int32_t iVar12;
  int32_t iVar13;
  exr_result_t eVar14;
  
  if (ctxt == (exr_const_context_t)0x0) {
    eVar14 = 2;
  }
  else {
    if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
      eVar14 = (**(code **)(ctxt + 0x48))
                         (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                          *(code **)(ctxt + 0x48));
      return eVar14;
    }
    if (cinfo == (exr_chunk_info_t *)0x0 || encode == (exr_encode_pipeline_t *)0x0) {
      eVar14 = (**(code **)(ctxt + 0x38))(ctxt,3);
      return eVar14;
    }
    if ((encode->context != ctxt) || (encode->part_index != part_index)) {
      eVar14 = (**(code **)(ctxt + 0x48))
                         (ctxt,3,
                          "Cross-wired request for default routines from different context / part",
                          ctxt,*(code **)(ctxt + 0x48));
      return eVar14;
    }
    part = *(_internal_exr_part **)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
    if (encode->packed_buffer == encode->compressed_buffer) {
      encode->compressed_buffer = (void *)0x0;
    }
    encode->packed_bytes = 0;
    encode->packed_sample_count_bytes = 0;
    encode->compressed_bytes = 0;
    eVar14 = internal_coding_update_channel_info
                       (encode->channels,encode->channel_count,cinfo,(_internal_exr_context *)ctxt,
                        part);
    if (eVar14 == 0) {
      iVar10 = cinfo->idx;
      iVar11 = cinfo->start_x;
      iVar12 = cinfo->start_y;
      iVar13 = cinfo->height;
      iVar5 = cinfo->width;
      uVar6 = cinfo->level_x;
      uVar7 = cinfo->level_y;
      uVar8 = cinfo->type;
      uVar9 = cinfo->compression;
      uVar1 = cinfo->data_offset;
      uVar2 = cinfo->packed_size;
      uVar3 = cinfo->unpacked_size;
      uVar4 = cinfo->sample_count_table_size;
      (encode->chunk).sample_count_data_offset = cinfo->sample_count_data_offset;
      (encode->chunk).sample_count_table_size = uVar4;
      (encode->chunk).packed_size = uVar2;
      (encode->chunk).unpacked_size = uVar3;
      (encode->chunk).width = iVar5;
      (encode->chunk).level_x = uVar6;
      (encode->chunk).level_y = uVar7;
      (encode->chunk).type = uVar8;
      (encode->chunk).compression = uVar9;
      (encode->chunk).data_offset = uVar1;
      (encode->chunk).idx = iVar10;
      (encode->chunk).start_x = iVar11;
      (encode->chunk).start_y = iVar12;
      (encode->chunk).height = iVar13;
    }
  }
  return eVar14;
}

Assistant:

exr_result_t
exr_encoding_update (
    exr_const_context_t     ctxt,
    int                     part_index,
    const exr_chunk_info_t* cinfo,
    exr_encode_pipeline_t*  encode)
{
    exr_result_t rv;

    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);
    if (!cinfo || !encode)
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT));

    if (encode->context != ctxt || encode->part_index != part_index)
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Cross-wired request for default routines from different context / part"));

    if (encode->packed_buffer == encode->compressed_buffer)
        encode->compressed_buffer = NULL;

    encode->packed_bytes              = 0;
    encode->packed_sample_count_bytes = 0;
    encode->compressed_bytes          = 0;

    rv = internal_coding_update_channel_info (
        encode->channels, encode->channel_count, cinfo, pctxt, part);

    if (rv == EXR_ERR_SUCCESS) encode->chunk = *cinfo;
    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (rv);
}